

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::renderBuffers(SceneRender *this,Uniforms *_uniforms)

{
  value_type pFVar1;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_type sVar8;
  size_type sVar9;
  reference ppFVar10;
  Fbo *this_00;
  mat4 *pmVar11;
  Shader *pSVar12;
  vec3 *pvVar13;
  vec3 *v2;
  mat4 *m2;
  pointer ppVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Tracker *pTVar15;
  string *psVar16;
  vec<3,_float,_(glm::qualifier)0> vVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  mat<4,_4,_float,_(glm::qualifier)0> local_41c;
  allocator local_3d9;
  string local_3d8;
  vec3 local_3b8;
  vec3 local_3a8;
  allocator local_399;
  string local_398;
  mat<4,_4,_float,_(glm::qualifier)0> local_374;
  mat<4,_4,_float,_(glm::qualifier)0> local_334;
  allocator local_2f1;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  _Self local_270;
  _Self local_268;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  mat<4,_4,_float,_(glm::qualifier)0> local_21c;
  allocator local_1d9;
  string local_1d8;
  vec3 local_1b8;
  vec3 local_1a8;
  allocator local_199;
  string local_198;
  mat<4,_4,_float,_(glm::qualifier)0> local_174;
  mat<4,_4,_float,_(glm::qualifier)0> local_134;
  allocator local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 local_70 [8];
  string bufferName;
  size_t i_2;
  Shader *bufferShader;
  Fbo *local_30;
  ulong local_28;
  size_t i_1;
  size_t i;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  sVar9 = this->m_buffers_total;
  i = (size_t)_uniforms;
  _uniforms_local = (Uniforms *)this;
  sVar8 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffersFbo);
  if (sVar9 != sVar8) {
    for (i_1 = 0; sVar3 = i_1,
        sVar9 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffersFbo),
        sVar3 < sVar9; i_1 = i_1 + 1) {
      ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (&this->buffersFbo,i_1);
      if (*ppFVar10 != (value_type)0x0) {
        (*(*ppFVar10)->_vptr_Fbo[1])();
      }
    }
    std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::clear(&this->buffersFbo);
    for (local_28 = 0; local_28 < this->m_buffers_total; local_28 = local_28 + 1) {
      this_00 = (Fbo *)operator_new(0x38);
      vera::Fbo::Fbo(this_00);
      local_30 = this_00;
      std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::push_back(&this->buffersFbo,&local_30)
      ;
      ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (&this->buffersFbo,local_28);
      pFVar1 = *ppFVar10;
      uVar5 = vera::getWindowWidth();
      uVar6 = vera::getWindowHeight();
      (*pFVar1->_vptr_Fbo[2])(pFVar1,(ulong)uVar5,(ulong)uVar6,4,0,0,1);
    }
  }
  for (bufferName.field_2._8_8_ = 0; uVar2 = bufferName.field_2._8_8_,
      sVar9 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffersFbo),
      (ulong)uVar2 < sVar9; bufferName.field_2._8_8_ = bufferName.field_2._8_8_ + 1) {
    ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                         (&this->buffersFbo,bufferName.field_2._8_8_);
    bVar4 = vera::Fbo::isAllocated(*ppFVar10);
    if (!bVar4) {
      ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (&this->buffersFbo,bufferName.field_2._8_8_);
      pFVar1 = *ppFVar10;
      uVar5 = vera::getWindowWidth();
      uVar6 = vera::getWindowHeight();
      (*pFVar1->_vptr_Fbo[2])(pFVar1,(ulong)uVar5,(ulong)uVar6,4,0,0,1);
    }
    ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                         (&this->buffersFbo,bufferName.field_2._8_8_);
    (*(*ppFVar10)->_vptr_Fbo[3])();
    vera::toString<unsigned_long>(&local_90,(unsigned_long *)(bufferName.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   "u_sceneBuffer",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if ((this->m_depth_test & 1U) != 0) {
      glEnable(0xb71);
    }
    if (((*(byte *)(*(long *)(i + 0x1f0) + 0x20) & 1) != 0) ||
       (((this->m_origin).bChange & 1U) != 0)) {
      vera::setCamera(*(Camera **)(i + 0x1f0));
      pmVar11 = vera::Node::getTransformMatrix(&this->m_origin);
      vera::applyMatrix(pmVar11);
    }
    if ((-1 < this->m_floor_subd_target) &&
       (pSVar12 = vera::Model::getBufferShader(&this->m_floor,(string *)local_70),
       pSVar12 != (Shader *)0x0)) {
      bVar4 = Tracker::isRunning((Tracker *)(i + 0x3a0));
      if (bVar4) {
        pTVar15 = (Tracker *)(i + 0x3a0);
        std::operator+(&local_d0,"render:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        std::operator+(&local_b0,&local_d0,":floor");
        Tracker::begin(pTVar15,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      vera::Shader::use(pSVar12);
      (**(code **)(*(long *)i + 0x1f0))(i,pSVar12,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"u_modelViewProjectionMatrix",&local_f1);
      vera::getProjectionViewWorldMatrix();
      pmVar11 = vera::Node::getTransformMatrix(&(this->m_floor).super_Node);
      glm::operator*(&local_134,&local_174,pmVar11);
      vera::Shader::setUniform(pSVar12,&local_f0,&local_134,false);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"u_model",&local_199);
      pvVar13 = vera::Node::getPosition(&this->m_origin);
      v2 = vera::Node::getPosition(&(this->m_floor).super_Node);
      vVar17 = glm::operator+(pvVar13,v2);
      local_1b8.field_2 = vVar17.field_2;
      local_1b8._0_8_ = vVar17._0_8_;
      local_1a8._0_8_ = local_1b8._0_8_;
      local_1a8.field_2 = local_1b8.field_2;
      vera::Shader::setUniform(pSVar12,&local_198,&local_1a8);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,"u_modelMatrix",&local_1d9);
      pmVar11 = vera::Node::getTransformMatrix(&this->m_origin);
      m2 = vera::Node::getTransformMatrix(&(this->m_floor).super_Node);
      glm::operator*(&local_21c,pmVar11,m2);
      vera::Shader::setUniform(pSVar12,&local_1d8,&local_21c,false);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      vera::Model::render(&this->m_floor,pSVar12);
      bVar4 = Tracker::isRunning((Tracker *)(i + 0x3a0));
      if (bVar4) {
        pTVar15 = (Tracker *)(i + 0x3a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                       "render:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                       ":floor");
        Tracker::end(pTVar15,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&it);
      }
    }
    vera::cullingMode(this->m_culling);
    local_268._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                  *)(i + 0x128));
    while( true ) {
      local_270._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                  *)(i + 0x128));
      bVar4 = std::operator!=(&local_268,&local_270);
      if (!bVar4) break;
      ppVar14 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                ::operator->(&local_268);
      pSVar12 = vera::Model::getBufferShader(ppVar14->second,(string *)local_70);
      if (pSVar12 != (Shader *)0x0) {
        bVar4 = Tracker::isRunning((Tracker *)(i + 0x3a0));
        if (bVar4) {
          pTVar15 = (Tracker *)(i + 0x3a0);
          std::operator+(&local_2d0,"render:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
          std::operator+(&local_2b0,&local_2d0,":");
          ppVar14 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                    ::operator->(&local_268);
          psVar16 = vera::Model::getName_abi_cxx11_(ppVar14->second);
          std::operator+(&local_290,&local_2b0,psVar16);
          Tracker::begin(pTVar15,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
        }
        vera::Shader::use(pSVar12);
        (**(code **)(*(long *)i + 0x1f0))(i,pSVar12,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2f0,"u_modelViewProjectionMatrix",&local_2f1);
        vera::getProjectionViewWorldMatrix();
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                  ::operator->(&local_268);
        iVar7 = (*(ppVar14->second->super_Node)._vptr_Node[0x20])();
        glm::operator*(&local_334,&local_374,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar7));
        vera::Shader::setUniform(pSVar12,&local_2f0,&local_334,false);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_398,"u_model",&local_399);
        pvVar13 = vera::Node::getPosition(&this->m_origin);
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                  ::operator->(&local_268);
        iVar7 = (*(ppVar14->second->super_Node)._vptr_Node[0x13])();
        vVar17 = glm::operator+(pvVar13,(vec<3,_float,_(glm::qualifier)0> *)
                                        CONCAT44(extraout_var_00,iVar7));
        local_3b8.field_2 = vVar17.field_2;
        local_3b8._0_8_ = vVar17._0_8_;
        local_3a8._0_8_ = local_3b8._0_8_;
        local_3a8.field_2 = local_3b8.field_2;
        vera::Shader::setUniform(pSVar12,&local_398,&local_3a8);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator((allocator<char> *)&local_399);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3d8,"u_modelMatrix",&local_3d9);
        pmVar11 = vera::Node::getTransformMatrix(&this->m_origin);
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                  ::operator->(&local_268);
        iVar7 = (*(ppVar14->second->super_Node)._vptr_Node[0x20])();
        glm::operator*(&local_41c,pmVar11,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var_01,iVar7));
        vera::Shader::setUniform(pSVar12,&local_3d8,&local_41c,false);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                  ::operator->(&local_268);
        vera::Model::render(ppVar14->second,pSVar12);
        bVar4 = Tracker::isRunning((Tracker *)(i + 0x3a0));
        if (bVar4) {
          pTVar15 = (Tracker *)(i + 0x3a0);
          std::operator+(&local_480,"render:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
          std::operator+(&local_460,&local_480,":");
          ppVar14 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                    ::operator->(&local_268);
          psVar16 = vera::Model::getName_abi_cxx11_(ppVar14->second);
          std::operator+(&local_440,&local_460,psVar16);
          Tracker::end(pTVar15,&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_480);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
      ::operator++(&local_268);
    }
    if ((this->m_depth_test & 1U) != 0) {
      glDisable(0xb71);
    }
    if (this->m_culling != CULL_NONE) {
      glDisable(0xb44);
    }
    ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                         (&this->buffersFbo,bufferName.field_2._8_8_);
    (*(*ppFVar10)->_vptr_Fbo[4])();
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void SceneRender::renderBuffers(Uniforms& _uniforms) {
    if ( m_buffers_total != buffersFbo.size() ) {
        for (size_t i = 0; i < buffersFbo.size(); i++)
            delete buffersFbo[i];
        buffersFbo.clear();
        
        for (size_t i = 0; i < m_buffers_total; i++) {
            buffersFbo.push_back( new vera::Fbo() );

            // glm::vec2 size = glm::vec2(vera::getWindowWidth(), vera::getWindowHeight());
            // buffersFbo[i].fixed = getBufferSize(_fragmentShader, "u_sceneBuffer" + vera::toString(i), size);
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
        }
    }

    vera::Shader* bufferShader = nullptr;
    for (size_t i = 0; i < buffersFbo.size(); i++) {
        if (!buffersFbo[i]->isAllocated())
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
            // continue;;

        buffersFbo[i]->bind();
        std::string bufferName = "u_sceneBuffer" + vera::toString(i);

        // Begining of DEPTH for 3D 
        if (m_depth_test)
            glEnable(GL_DEPTH_TEST);

        if (_uniforms.activeCamera->bChange || m_origin.bChange) {
            vera::setCamera( _uniforms.activeCamera );
            vera::applyMatrix( m_origin.getTransformMatrix() );
        }

        if (m_floor_subd_target >= 0) {
            bufferShader = m_floor.getBufferShader(bufferName);
            if (bufferShader != nullptr) {
                    TRACK_BEGIN("render:"+bufferName+":floor")
                    bufferShader->use();
                    _uniforms.feedTo( bufferShader, false );
                    bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix() );
                    bufferShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                    bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                    m_floor.render(bufferShader);
                    TRACK_END("render:"+bufferName+":floor")
                }
        }

        vera::cullingMode(m_culling);

        for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
            bufferShader = it->second->getBufferShader(bufferName);

            if (bufferShader != nullptr) {
                TRACK_BEGIN("render:" + bufferName + ":" + it->second->getName())

                // bind the shader
                bufferShader->use();

                // Update Uniforms and textures variables to the shader
                _uniforms.feedTo( bufferShader, false );

                // Pass special uniforms
                bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
                bufferShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
                bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
                it->second->render(bufferShader);

                TRACK_END("render:" + bufferName + ":" + it->second->getName())
            }
        }

        if (m_depth_test)
            glDisable(GL_DEPTH_TEST);

        if (m_culling != 0)
            glDisable(GL_CULL_FACE);

        buffersFbo[i]->unbind();
    }
}